

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

word * Gia_ObjComputeTruthTableCut(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  word Fill;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  Gia_Obj_t *pGVar15;
  uint uVar16;
  long lVar17;
  word *pwVar18;
  word *pwVar19;
  Vec_Int_t *pVVar20;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vTtMemory != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x289,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  if (p->nTtVars < vLeaves->nSize) {
    __assert_fail("Vec_IntSize(vLeaves) <= p->nTtVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x28a,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  if (p->vTtNums->nSize < p->nObjs) {
    Vec_IntFillExtra(p->vTtNums,p->nObjs,-1000000000);
  }
  pGVar15 = p->pObjs;
  if ((pGVar15 <= pRoot) && (pRoot < pGVar15 + p->nObjs)) {
    Gia_ObjCollectInternalCut
              (p,(int)((ulong)((long)pRoot - (long)pGVar15) >> 2) * -0x55555555,vLeaves);
    pVVar20 = p->vTtNodes;
    uVar12 = pVVar20->nSize;
    iVar9 = (uVar12 + 2) * p->nTtWords;
    if (p->vTtMemory->nSize < iVar9) {
      Vec_WrdFillExtra(p->vTtMemory,iVar9,Fill);
      pVVar20 = p->vTtNodes;
      uVar12 = pVVar20->nSize;
    }
    if ((int)uVar12 < 2) {
      pwVar10 = p->vTtMemory->pArray;
      iVar9 = p->nTtWords;
      pVVar7 = p->vTtNums;
      pGVar15 = p->pObjs;
    }
    else {
      piVar4 = pVVar20->pArray;
      pVVar7 = p->vTtNums;
      uVar14 = 1;
      do {
        iVar9 = piVar4[uVar14];
        lVar17 = (long)iVar9;
        if ((lVar17 < 0) || (uVar11 = pVVar7->nSize, (int)uVar11 <= iVar9)) goto LAB_0023a6de;
        piVar5 = pVVar7->pArray;
        if (uVar14 != (uint)piVar5[lVar17]) {
          __assert_fail("i == Gia_ObjNumId(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                        ,0x296,
                        "word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        if (p->nObjs <= iVar9) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar15 = p->pObjs;
        uVar6 = *(ulong *)(pGVar15 + lVar17);
        uVar8 = iVar9 - ((uint)uVar6 & 0x1fffffff);
        if (((((int)uVar8 < 0) || (uVar11 <= uVar8)) ||
            (uVar16 = iVar9 - ((uint)(uVar6 >> 0x20) & 0x1fffffff), (int)uVar16 < 0)) ||
           (uVar11 <= uVar16)) goto LAB_0023a6de;
        iVar9 = p->nTtWords;
        pwVar10 = p->vTtMemory->pArray;
        iVar13 = piVar5[uVar8];
        iVar3 = piVar5[uVar16];
        if (iVar13 < 1) {
          uVar8 = -iVar13;
          uVar11 = p->vTtInputs->nSize;
          if (uVar11 == uVar8 || SBORROW4(uVar11,uVar8) != (int)(uVar11 + iVar13) < 0)
          goto LAB_0023a73b;
          pwVar18 = (word *)p->vTtInputs->pArray[uVar8];
        }
        else {
          pwVar18 = pwVar10 + iVar13 * iVar9;
        }
        if (iVar3 < 1) {
          uVar8 = -iVar3;
          uVar11 = p->vTtInputs->nSize;
          if (uVar11 == uVar8 || SBORROW4(uVar11,uVar8) != (int)(uVar11 + iVar3) < 0) {
LAB_0023a73b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pwVar19 = (word *)p->vTtInputs->pArray[uVar8];
        }
        else {
          pwVar19 = pwVar10 + iVar3 * iVar9;
        }
        iVar13 = (int)uVar14;
        puVar1 = pwVar10 + (long)(iVar9 * iVar13) + (long)iVar9;
        if (((uint)uVar6 >> 0x1d & 1) == 0) {
          if ((uVar6 >> 0x3d & 1) == 0) {
            if (0 < iVar9) {
              lVar17 = 0;
              do {
                puVar2 = (ulong *)((long)pwVar10 + lVar17 + (long)(iVar9 * iVar13) * 8);
                *puVar2 = *(ulong *)((long)pwVar19 + lVar17) & *(ulong *)((long)pwVar18 + lVar17);
                lVar17 = lVar17 + 8;
              } while (puVar2 + 1 < puVar1);
            }
          }
          else if (0 < iVar9) {
            lVar17 = 0;
            do {
              puVar2 = (ulong *)((long)pwVar10 + lVar17 + (long)(iVar9 * iVar13) * 8);
              *puVar2 = ~*(ulong *)((long)pwVar19 + lVar17) & *(ulong *)((long)pwVar18 + lVar17);
              lVar17 = lVar17 + 8;
            } while (puVar2 + 1 < puVar1);
          }
        }
        else if ((uVar6 >> 0x3d & 1) == 0) {
          if (0 < iVar9) {
            lVar17 = 0;
            do {
              puVar2 = (ulong *)((long)pwVar10 + lVar17 + (long)(iVar9 * iVar13) * 8);
              *puVar2 = ~*(ulong *)((long)pwVar18 + lVar17) & *(ulong *)((long)pwVar19 + lVar17);
              lVar17 = lVar17 + 8;
            } while (puVar2 + 1 < puVar1);
          }
        }
        else if (0 < iVar9) {
          lVar17 = 0;
          do {
            puVar2 = (ulong *)((long)pwVar10 + lVar17 + (long)(iVar9 * iVar13) * 8);
            *puVar2 = ~(*(ulong *)((long)pwVar19 + lVar17) | *(ulong *)((long)pwVar18 + lVar17));
            lVar17 = lVar17 + 8;
          } while (puVar2 + 1 < puVar1);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar12);
    }
    if ((pGVar15 <= pRoot) && (pRoot < pGVar15 + p->nObjs)) {
      uVar11 = (int)((long)pRoot - (long)pGVar15 >> 2) * -0x55555555;
      if (((int)uVar11 < 0) || (pVVar7->nSize <= (int)uVar11)) {
LAB_0023a6de:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = pVVar7->pArray;
      iVar13 = piVar4[uVar11 & 0x7fffffff];
      if (0 < vLeaves->nSize) {
        piVar5 = vLeaves->pArray;
        lVar17 = 0;
        do {
          iVar3 = piVar5[lVar17];
          if (((long)iVar3 < 0) || (pVVar7->nSize <= iVar3)) goto LAB_0023a6bf;
          piVar4[iVar3] = -1000000000;
          lVar17 = lVar17 + 1;
        } while (lVar17 < vLeaves->nSize);
        uVar12 = pVVar20->nSize;
      }
      if (1 < (int)uVar12) {
        piVar5 = pVVar20->pArray;
        lVar17 = 1;
        do {
          iVar3 = piVar5[lVar17];
          if (((long)iVar3 < 0) || (pVVar7->nSize <= iVar3)) {
LAB_0023a6bf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar4[iVar3] = -1000000000;
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar20->nSize);
      }
      return pwVar10 + (long)iVar13 * (long)iVar9;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

word * Gia_ObjComputeTruthTableCut( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pTemp;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i, iObj, Id0, Id1;
    assert( p->vTtMemory != NULL );
    assert( Vec_IntSize(vLeaves) <= p->nTtVars );
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), -ABC_INFINITY );
    // collect internal nodes
    Gia_ObjCollectInternalCut( p, Gia_ObjId(p, pRoot), vLeaves );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
    {
        assert( i == Gia_ObjNumId(p, iObj) );
        pTemp   = Gia_ManObj( p, iObj );
        pTruth  = Gla_ObjTruthNodeId( p, i );  
        pTruthL = pTruth + p->nTtWords;
        Id0 = Gia_ObjNumId( p, Gia_ObjFaninId0(pTemp, iObj) );
        Id1 = Gia_ObjNumId( p, Gia_ObjFaninId1(pTemp, iObj) );
        pTruth0 = (Id0 > 0) ? Gla_ObjTruthNodeId(p, Id0) : Gla_ObjTruthElem(p, -Id0);
        pTruth1 = (Id1 > 0) ? Gla_ObjTruthNodeId(p, Id1) : Gla_ObjTruthElem(p, -Id1);
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    pTruth = Gla_ObjTruthNode( p, pRoot );
    // unmark leaves marked by Gia_ObjCollectInternal()
    Vec_IntForEachEntry( vLeaves, iObj, i )
        Gia_ObjResetNumId( p, iObj );
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
        Gia_ObjResetNumId( p, iObj );
    return pTruth;
}